

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O0

Cut_Cut_t * Cut_CutMergeLists(Cut_Cut_t *pList1,Cut_Cut_t *pList2)

{
  int iVar1;
  Cut_Cut_t *local_40;
  Cut_Cut_t *local_30;
  Cut_Cut_t *pCut;
  Cut_Cut_t **ppTail;
  Cut_Cut_t *pList;
  Cut_Cut_t *pList2_local;
  Cut_Cut_t *pList1_local;
  
  ppTail = (Cut_Cut_t **)0x0;
  pCut = (Cut_Cut_t *)&ppTail;
  pList = pList2;
  pList2_local = pList1;
  while (pList2_local != (Cut_Cut_t *)0x0 && pList != (Cut_Cut_t *)0x0) {
    iVar1 = Cut_CutCompare(pList2_local,pList);
    if (iVar1 < 0) {
      local_30 = pList2_local;
      pList2_local = pList2_local->pNext;
    }
    else {
      local_30 = pList;
      pList = pList->pNext;
    }
    *(Cut_Cut_t **)pCut = local_30;
    pCut = (Cut_Cut_t *)&local_30->pNext;
  }
  if (pList2_local == (Cut_Cut_t *)0x0) {
    local_40 = pList;
  }
  else {
    local_40 = pList2_local;
  }
  *(Cut_Cut_t **)pCut = local_40;
  return (Cut_Cut_t *)ppTail;
}

Assistant:

Cut_Cut_t * Cut_CutMergeLists( Cut_Cut_t * pList1, Cut_Cut_t * pList2 )
{
    Cut_Cut_t * pList = NULL, ** ppTail = &pList;
    Cut_Cut_t * pCut;
    while ( pList1 && pList2 )
    {
        if ( Cut_CutCompare(pList1, pList2) < 0 )
        {
            pCut = pList1;
            pList1 = pList1->pNext;
        }
        else
        {
            pCut = pList2;
            pList2 = pList2->pNext;
        }
        *ppTail = pCut;
        ppTail = &pCut->pNext;
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}